

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O1

void __thiscall
pbrt::FormattingScene::Integrator
          (FormattingScene *this,string *name,ParsedParameterVector params,FileLoc loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  undefined8 *puVar4;
  long *plVar5;
  ostream *poVar6;
  ulong *puVar7;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDX;
  ulong uVar8;
  undefined8 uVar9;
  _Alloc_hider _Var10;
  string extra;
  ParameterDictionary dict;
  string local_190;
  string local_170;
  string local_150;
  vector<int,_std::allocator<int>_> local_130;
  char *local_118;
  long local_110;
  char local_108;
  undefined7 uStack_107;
  ParameterDictionary local_f8;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  local_90;
  
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(&local_90,in_RDX);
  ParameterDictionary::ParameterDictionary(&local_f8,&local_90,RGBColorSpace::sRGB);
  local_90.nStored = 0;
  (*(local_90.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_90.alloc.memoryResource,local_90.ptr,local_90.nAlloc << 3,8);
  local_110 = 0;
  local_108 = '\0';
  local_118 = &local_108;
  if (this->upgrade == true) {
    iVar3 = std::__cxx11::string::compare((char *)name);
    if (iVar3 == 0) {
      paVar1 = &local_190.field_2;
      local_190._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"imagewritefrequency","")
      ;
      ParameterDictionary::RemoveInt(&local_f8,&local_190);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != paVar1) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
      local_190._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"numiterations","");
      ParameterDictionary::GetIntArray(&local_130,&local_f8,&local_190);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != paVar1) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
      if (local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        local_190._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"numiterations","");
        ParameterDictionary::RemoveInt(&local_f8,&local_190);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != paVar1) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
        }
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_170,
                   (char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc + '\x04');
        paVar2 = &local_150.field_2;
        local_150._M_string_length = 0;
        local_150.field_2._M_local_buf[0] = '\0';
        local_150._M_dataplus._M_p = (pointer)paVar2;
        detail::stringPrintfRecursive<int&>
                  (&local_150,"\"integer iterations\" [ %d ]\n",
                   local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start);
        uVar9 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          uVar9 = local_170.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar9 < local_150._M_string_length + local_170._M_string_length) {
          uVar8 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != paVar2) {
            uVar8 = CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                             local_150.field_2._M_local_buf[0]);
          }
          if (uVar8 < local_150._M_string_length + local_170._M_string_length) goto LAB_0052f39d;
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_150,0,(char *)0x0,(ulong)local_170._M_dataplus._M_p);
        }
        else {
LAB_0052f39d:
          puVar4 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_170,(ulong)local_150._M_dataplus._M_p);
        }
        puVar7 = puVar4 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar7) {
          local_190.field_2._M_allocated_capacity = *puVar7;
          local_190.field_2._8_8_ = puVar4[3];
          local_190._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_190.field_2._M_allocated_capacity = *puVar7;
          local_190._M_dataplus._M_p = (pointer)*puVar4;
        }
        local_190._M_string_length = puVar4[1];
        *puVar4 = puVar7;
        puVar4[1] = 0;
        *(undefined1 *)puVar7 = 0;
        std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_190._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != paVar1) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != paVar2) {
          operator_delete(local_150._M_dataplus._M_p,
                          CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                                   local_150.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    paVar1 = &local_170.field_2;
    local_170._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"lightsamplestrategy","");
    paVar2 = &local_150.field_2;
    local_150._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"");
    ParameterDictionary::GetOneString(&local_190,&local_f8,&local_170,&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar2) {
      operator_delete(local_150._M_dataplus._M_p,
                      CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                               local_150.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar1) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    iVar3 = std::__cxx11::string::compare((char *)&local_190);
    if (iVar3 == 0) {
      local_170._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"lightsamplestrategy","")
      ;
      ParameterDictionary::RemoveString(&local_f8,&local_170);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != paVar1) {
        operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
      }
      local_150._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct
                ((ulong)&local_150,
                 (char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc + '\x04');
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_150);
      puVar7 = (ulong *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar7) {
        local_170.field_2._M_allocated_capacity = *puVar7;
        local_170.field_2._8_8_ = plVar5[3];
        local_170._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_170.field_2._M_allocated_capacity = *puVar7;
        local_170._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_170._M_string_length = plVar5[1];
      *plVar5 = (long)puVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_170._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != paVar1) {
        operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != paVar2) {
        operator_delete(local_150._M_dataplus._M_p,
                        CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                                 local_150.field_2._M_local_buf[0]) + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->upgrade == true) && (iVar3 = std::__cxx11::string::compare((char *)name), iVar3 == 0))
  {
    paVar1 = &local_190.field_2;
    local_190._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct
              ((ulong)&local_190,(char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc);
    Printf<std::__cxx11::string>("%sIntegrator \"path\"\n",&local_190);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != paVar1) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct
              ((ulong)&local_170,
               (char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc + '\x04');
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_170);
    puVar7 = (ulong *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar7) {
      local_190.field_2._M_allocated_capacity = *puVar7;
      local_190.field_2._8_8_ = plVar5[3];
      local_190._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_190.field_2._M_allocated_capacity = *puVar7;
      local_190._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_190._M_string_length = plVar5[1];
    *plVar5 = (long)puVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_190._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != paVar1) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
    uVar9 = local_170.field_2._M_allocated_capacity;
    _Var10._M_p = local_170._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p == &local_170.field_2) goto LAB_0052f695;
  }
  else {
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct
              ((ulong)&local_190,(char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc);
    Printf<std::__cxx11::string,std::__cxx11::string_const&>
              ("%sIntegrator \"%s\"\n",&local_190,name);
    uVar9 = local_190.field_2._M_allocated_capacity;
    _Var10._M_p = local_190._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p == &local_190.field_2) goto LAB_0052f695;
  }
  operator_delete(_Var10._M_p,uVar9 + 1);
LAB_0052f695:
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_118,local_110);
  ParameterDictionary::ToParameterList_abi_cxx11_
            (&local_190,&local_f8,*(int *)&(this->super_SceneRepresentation).field_0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,local_190._M_dataplus._M_p,local_190._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if (local_118 != &local_108) {
    operator_delete(local_118,CONCAT71(uStack_107,local_108) + 1);
  }
  local_f8.params.nStored = 0;
  (*(local_f8.params.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_f8.params.alloc.memoryResource,local_f8.params.ptr,local_f8.params.nAlloc << 3,8)
  ;
  return;
}

Assistant:

void FormattingScene::Integrator(const std::string &name, ParsedParameterVector params,
                                 FileLoc loc) {
    ParameterDictionary dict(std::move(params), RGBColorSpace::sRGB);

    std::string extra;
    if (upgrade) {
        if (name == "sppm") {
            dict.RemoveInt("imagewritefrequency");

            std::vector<int> iterations = dict.GetIntArray("numiterations");
            if (!iterations.empty()) {
                dict.RemoveInt("numiterations");
                extra += indent(1) +
                         StringPrintf("\"integer iterations\" [ %d ]\n", iterations[0]);
            }
        }
        std::string lss = dict.GetOneString("lightsamplestrategy", "");
        if (lss == "spatial") {
            dict.RemoveString("lightsamplestrategy");
            extra += indent(1) + "\"string lightsamplestrategy\" \"bvh\"\n";
        }
    }

    if (upgrade && name == "directlighting") {
        Printf("%sIntegrator \"path\"\n", indent());
        extra += indent(1) + "\"integer maxdepth\" [ 1 ]\n";
    } else
        Printf("%sIntegrator \"%s\"\n", indent(), name);
    std::cout << extra << dict.ToParameterList(catIndentCount);
}